

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Group * __thiscall SceneParser::parseGroup(SceneParser *this)

{
  pointer *pppOVar1;
  iterator iVar2;
  Material *pMVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Group *this_00;
  int iVar7;
  Object3D *object;
  char token [100];
  Object3D *local_a8;
  vector<Object3D*,std::allocator<Object3D*>> *local_a0;
  short local_98;
  undefined4 uStack_96;
  undefined2 uStack_92;
  undefined3 uStack_90;
  undefined3 uStack_8d;
  
  getToken(this,(char *)&local_98);
  if (local_98 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x117,"Group *SceneParser::parseGroup()");
  }
  getToken(this,(char *)&local_98);
  if (CONCAT35(uStack_90,CONCAT23(uStack_92,uStack_96._1_3_)) == 0x737463656a624f &&
      CONCAT26(uStack_92,CONCAT42(uStack_96,local_98)) == 0x63656a624f6d756e) {
    iVar5 = readInt(this);
    this_00 = (Group *)operator_new(0x48);
    (this_00->super_Object3D)._vptr_Object3D = (_func_int **)0x0;
    (this_00->super_Object3D).type._M_dataplus._M_p = (pointer)0x0;
    (this_00->super_Object3D).type._M_string_length = 0;
    (this_00->super_Object3D).type.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(this_00->super_Object3D).type.field_2 + 8) = 0;
    (this_00->super_Object3D).material = (Material *)0x0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar7 = 0;
    (this_00->m_members).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->super_Object3D).type._M_dataplus._M_p =
         (pointer)&(this_00->super_Object3D).type.field_2;
    (this_00->super_Object3D).type._M_string_length = 0;
    (this_00->super_Object3D).type.field_2._M_local_buf[0] = '\0';
    (this_00->super_Object3D).material = (Material *)0x0;
    (this_00->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Group_0013fa08;
    if (0 < iVar5) {
      local_a0 = (vector<Object3D*,std::allocator<Object3D*>> *)&this->_objects;
      bVar4 = false;
      do {
        getToken(this,(char *)&local_98);
        if (CONCAT35(uStack_8d,CONCAT32(uStack_90,uStack_92)) == 0x7865646e496c61 &&
            CONCAT26(uStack_92,CONCAT42(uStack_96,local_98)) == 0x6c6169726574614d) {
          uVar6 = readInt(this);
          if (((int)uVar6 < 0) || (this->_num_materials < (int)uVar6)) {
            __assert_fail("index >= 0 && index <= getNumMaterials()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                          ,0x128,"Group *SceneParser::parseGroup()");
          }
          if (this->_num_materials <= (int)uVar6) {
            __assert_fail("i >= 0 && i < _num_materials",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.h"
                          ,0x37,"Material *SceneParser::getMaterial(int) const");
          }
          pMVar3 = (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6];
          this->_current_material = pMVar3;
          bVar4 = operator!=(&pMVar3->_light,&Vector3f::ZERO);
        }
        else {
          local_a8 = parseObject(this,(char *)&local_98);
          Group::addObject(this_00,local_a8);
          iVar2._M_current =
               (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Object3D*,std::allocator<Object3D*>>::_M_realloc_insert<Object3D*const&>
                      (local_a0,iVar2,&local_a8);
          }
          else {
            *iVar2._M_current = local_a8;
            pppOVar1 = &(this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppOVar1 = *pppOVar1 + 1;
          }
          if (bVar4 != false) {
            iVar2._M_current =
                 (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Object3D*,std::allocator<Object3D*>>::_M_realloc_insert<Object3D*const&>
                        ((vector<Object3D*,std::allocator<Object3D*>> *)this,iVar2,&local_a8);
            }
            else {
              *iVar2._M_current = local_a8;
              pppOVar1 = &(this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppOVar1 = *pppOVar1 + 1;
            }
          }
          iVar7 = iVar7 + 1;
        }
      } while (iVar7 < iVar5);
    }
    getToken(this,(char *)&local_98);
    if (local_98 == 0x7d) {
      return this_00;
    }
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x137,"Group *SceneParser::parseGroup()");
  }
  __assert_fail("!strcmp(token, \"numObjects\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x11b,"Group *SceneParser::parseGroup()");
}

Assistant:

Group *
SceneParser::parseGroup() {
    // Each group starts with an integer that specifies
    // the number of objects in the group.
    //
    // The material index sets the material of all objects which follow,
    // until the next material index (scoping for the materials is very
    // simple, and essentially ignores any tree hierarchy).
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numObjects"));
    int num_objects = readInt();

    Group *answer = new Group();

    // Read in the objects.
    int count = 0;
    bool in_light = false;
    while (num_objects > count) {
        getToken(token);
        if (!strcmp(token, "MaterialIndex")) {
            // Change the current material.
            int index = readInt();
            assert(index >= 0 && index <= getNumMaterials());
            _current_material = getMaterial(index);
            in_light = _current_material->getLight() != Vector3f::ZERO;
        } else {
            Object3D *object = parseObject(token);
            assert(object != NULL);
            answer->addObject(object);
            count++;
            _objects.push_back(object);
            if (in_light) {
                lights.push_back(object);
            }
        }
    }
    getToken(token);
    assert(!strcmp(token, "}"));

    // Return the group.
    return answer;
}